

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O0

S2CellUnion * __thiscall
S2CellUnion::Intersection(S2CellUnion *__return_storage_ptr__,S2CellUnion *this,S2CellId id)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  reference pSVar2;
  ostream *poVar3;
  byte local_f2;
  bool local_e1;
  S2LogMessage local_a0;
  S2LogMessageVoidify local_89;
  __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> local_88;
  uint64 local_80;
  uint64 local_78;
  __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> local_70;
  S2CellId local_68;
  S2CellId id_max;
  __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> local_48;
  const_iterator i;
  S2CellUnion *this_local;
  S2CellId id_local;
  S2CellUnion *result;
  
  this_local = (S2CellUnion *)id.id_;
  id_local.id_ = (uint64)__return_storage_ptr__;
  S2CellUnion(__return_storage_ptr__);
  bVar1 = Contains(this,(S2CellId)this_local);
  if (bVar1) {
    std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back
              (&__return_storage_ptr__->cell_ids_,(value_type *)&this_local);
  }
  else {
    __first = std::vector<S2CellId,_std::allocator<S2CellId>_>::begin(&this->cell_ids_);
    __last = std::vector<S2CellId,_std::allocator<S2CellId>_>::end(&this->cell_ids_);
    id_max = S2CellId::range_min((S2CellId *)&this_local);
    local_48 = std::
               lower_bound<__gnu_cxx::__normal_iterator<S2CellId_const*,std::vector<S2CellId,std::allocator<S2CellId>>>,S2CellId>
                         ((__normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                           )__first._M_current,
                          (__normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                           )__last._M_current,&id_max);
    local_68 = S2CellId::range_max((S2CellId *)&this_local);
    while( true ) {
      local_70._M_current =
           (S2CellId *)std::vector<S2CellId,_std::allocator<S2CellId>_>::end(&this->cell_ids_);
      bVar1 = __gnu_cxx::operator!=(&local_48,&local_70);
      local_e1 = false;
      if (bVar1) {
        pSVar2 = __gnu_cxx::
                 __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                 ::operator*(&local_48);
        local_78 = pSVar2->id_;
        local_80 = local_68.id_;
        local_e1 = operator<=((S2CellId)local_78,local_68);
      }
      if (local_e1 == false) break;
      local_88 = __gnu_cxx::
                 __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                 ::operator++(&local_48,0);
      pSVar2 = __gnu_cxx::
               __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
               ::operator*(&local_88);
      std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back
                (&__return_storage_ptr__->cell_ids_,pSVar2);
    }
  }
  bVar1 = IsNormalized(__return_storage_ptr__);
  local_f2 = 1;
  if (!bVar1) {
    bVar1 = IsNormalized(this);
    local_f2 = bVar1 ^ 0xff;
  }
  if (((local_f2 ^ 0xff) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_union.cc"
               ,0x13a,kFatal,(ostream *)&std::cerr);
    poVar3 = S2LogMessage::stream(&local_a0);
    poVar3 = std::operator<<(poVar3,"Check failed: result.IsNormalized() || !IsNormalized() ");
    S2LogMessageVoidify::operator&(&local_89,poVar3);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

S2CellUnion S2CellUnion::Intersection(S2CellId id) const {
  S2CellUnion result;
  if (Contains(id)) {
    result.cell_ids_.push_back(id);
  } else {
    vector<S2CellId>::const_iterator i = std::lower_bound(
        cell_ids_.begin(), cell_ids_.end(), id.range_min());
    S2CellId id_max = id.range_max();
    while (i != cell_ids_.end() && *i <= id_max)
      result.cell_ids_.push_back(*i++);
  }
  S2_DCHECK(result.IsNormalized() || !IsNormalized());
  return result;
}